

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O1

void __thiscall
cbtQuantizedBvh::walkStacklessQuantizedTreeAgainstRay
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,cbtVector3 *raySource,
          cbtVector3 *rayTarget,cbtVector3 *aabbMin,cbtVector3 *aabbMax,int startNodeIndex,
          int endNodeIndex)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  bool bVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  cbtQuantizedBvhNode *pcVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 in_XMM19 [16];
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  undefined4 uStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  cbtVector3 *local_d8;
  uint local_d0;
  uint local_cc;
  cbtQuantizedBvh *local_c8;
  cbtVector3 *local_c0;
  cbtVector3 *local_b8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  float *local_98;
  float *local_90;
  float *local_88;
  cbtNodeOverlapCallback *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pcVar18 = (this->m_quantizedContiguousNodes).m_data;
  fVar10 = rayTarget->m_floats[0] - raySource->m_floats[0];
  fVar11 = rayTarget->m_floats[1] - raySource->m_floats[1];
  fVar12 = rayTarget->m_floats[2] - raySource->m_floats[2];
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),ZEXT416((uint)fVar10),
                            ZEXT416((uint)fVar10));
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
  local_d8 = raySource;
  local_c8 = this;
  local_c0 = aabbMin;
  local_b8 = aabbMax;
  local_80 = nodeCallback;
  if (auVar26._0_4_ < 0.0) {
    fVar23 = sqrtf(auVar26._0_4_);
  }
  else {
    auVar26 = vsqrtss_avx(auVar26,auVar26);
    fVar23 = auVar26._0_4_;
  }
  auVar26 = ZEXT816(0) << 0x40;
  iVar15 = 0;
  if (startNodeIndex < endNodeIndex) {
    fVar23 = 1.0 / fVar23;
    fVar10 = fVar10 * fVar23;
    fVar11 = fVar11 * fVar23;
    fVar12 = fVar12 * fVar23;
    fVar23 = rayTarget->m_floats[0];
    fVar1 = rayTarget->m_floats[1];
    fVar2 = local_d8->m_floats[0];
    fVar3 = local_d8->m_floats[1];
    fVar4 = rayTarget->m_floats[2];
    fVar5 = local_d8->m_floats[2];
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)((fVar1 - fVar3) * fVar11)),ZEXT416((uint)fVar10),
                              ZEXT416((uint)(fVar23 - fVar2)));
    local_78 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar12),ZEXT416((uint)(fVar4 - fVar5)));
    auVar24 = SUB6416(ZEXT464(0x3f800000),0);
    auVar19 = vdivss_avx512f(auVar24,ZEXT416((uint)fVar10));
    uVar13 = vcmpss_avx512f(ZEXT416((uint)fVar10),auVar26,0);
    bVar14 = (bool)((byte)uVar13 & 1);
    local_48._4_12_ = auVar19._4_12_;
    local_48._0_4_ = (uint)bVar14 * 0x5d5e0b6b + (uint)!bVar14 * auVar19._0_4_;
    auVar27 = ZEXT1664(local_48);
    auVar19 = vdivss_avx512f(auVar24,ZEXT416((uint)fVar11));
    uVar13 = vcmpss_avx512f(ZEXT416((uint)fVar11),auVar26,0);
    bVar14 = (bool)((byte)uVar13 & 1);
    local_58._4_12_ = auVar19._4_12_;
    local_58._0_4_ = (uint)bVar14 * 0x5d5e0b6b + (uint)!bVar14 * auVar19._0_4_;
    auVar28 = ZEXT1664(local_58);
    auVar19 = vdivss_avx512f(auVar24,ZEXT416((uint)fVar12));
    uVar13 = vcmpss_avx512f(ZEXT416((uint)fVar12),auVar26,0);
    bVar14 = (bool)((byte)uVar13 & 1);
    local_68._4_12_ = auVar19._4_12_;
    local_68._0_4_ = (uint)bVar14 * 0x5d5e0b6b + (uint)!bVar14 * auVar19._0_4_;
    auVar29 = ZEXT1664(local_68);
    auVar8 = vminss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar2));
    auVar20 = vminss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar3));
    auVar9 = vminss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar5));
    auVar26 = vmaxss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar2));
    auVar19 = vmaxss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar3));
    auVar24 = vmaxss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar5));
    fVar10 = (local_c8->m_bvhAabbMin).m_floats[0];
    fVar11 = (local_c8->m_bvhAabbMin).m_floats[1];
    auVar8 = vmaxss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)(auVar8._0_4_ + local_c0->m_floats[0])))
    ;
    auVar20 = vmaxss_avx(ZEXT416((uint)fVar11),
                         ZEXT416((uint)(auVar20._0_4_ + local_c0->m_floats[1])));
    fVar12 = (local_c8->m_bvhAabbMin).m_floats[2];
    auVar9 = vmaxss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)(auVar9._0_4_ + local_c0->m_floats[2])))
    ;
    auVar21 = ZEXT416((uint)(local_c8->m_bvhAabbMax).m_floats[0]);
    auVar8 = vminss_avx(auVar21,auVar8);
    auVar22 = ZEXT416((uint)(local_c8->m_bvhAabbMax).m_floats[1]);
    auVar20 = vminss_avx(auVar22,auVar20);
    auVar25 = ZEXT416((uint)(local_c8->m_bvhAabbMax).m_floats[2]);
    auVar9 = vminss_avx(auVar25,auVar9);
    fVar23 = (local_c8->m_bvhQuantization).m_floats[0];
    fVar1 = (local_c8->m_bvhQuantization).m_floats[1];
    fVar2 = (local_c8->m_bvhQuantization).m_floats[2];
    local_cc = (int)(fVar1 * (auVar20._0_4_ - fVar11)) & 0xfffe;
    auVar26 = vmaxss_avx(ZEXT416((uint)fVar10),
                         ZEXT416((uint)(auVar26._0_4_ + local_b8->m_floats[0])));
    auVar19 = vmaxss_avx(ZEXT416((uint)fVar11),
                         ZEXT416((uint)(auVar19._0_4_ + local_b8->m_floats[1])));
    auVar24 = vmaxss_avx(ZEXT416((uint)fVar12),
                         ZEXT416((uint)(auVar24._0_4_ + local_b8->m_floats[2])));
    auVar26 = vminss_avx(auVar21,auVar26);
    auVar19 = vminss_avx(auVar22,auVar19);
    auVar24 = vminss_avx(auVar25,auVar24);
    local_d0 = (int)(fVar1 * (auVar19._0_4_ - fVar11) + 1.0) | 1;
    vucomiss_avx512f(local_68);
    vucomiss_avx512f(local_58);
    vucomiss_avx512f(local_48);
    pcVar18 = pcVar18 + startNodeIndex;
    local_88 = &local_f8;
    local_98 = &local_e8;
    local_a0 = &fStack_f4;
    local_90 = &fStack_e4;
    local_b0 = &fStack_f0;
    local_a8 = &fStack_e0;
    iVar15 = 0;
    do {
      uVar17 = 0;
      uVar16 = 0;
      iVar7 = pcVar18->m_escapeIndexOrTriangleIndex;
      if (((((((ushort)(int)(fVar23 * (auVar8._0_4_ - fVar10)) & 0xfffe) <=
              pcVar18->m_quantizedAabbMax[0]) &&
            (pcVar18->m_quantizedAabbMin[0] <=
             (ushort)((ushort)(int)(fVar23 * (auVar26._0_4_ - fVar10) + 1.0) | 1))) &&
           (((ushort)(int)(fVar2 * (auVar9._0_4_ - fVar12)) & 0xfffe) <=
            pcVar18->m_quantizedAabbMax[2])) &&
          ((uVar17 = uVar16,
           pcVar18->m_quantizedAabbMin[2] <=
           (ushort)((ushort)(int)(fVar2 * (auVar24._0_4_ - fVar12) + 1.0) | 1) &&
           ((ushort)local_cc <= pcVar18->m_quantizedAabbMax[1])))) &&
         (pcVar18->m_quantizedAabbMin[1] <= (ushort)local_d0)) {
        auVar19 = vcvtsi2ss_avx512f(in_XMM19,(uint)pcVar18->m_quantizedAabbMin[0]);
        fVar11 = (local_c8->m_bvhQuantization).m_floats[0];
        auVar20 = vcvtsi2ss_avx512f(in_XMM19,(uint)pcVar18->m_quantizedAabbMin[1]);
        fVar1 = (local_c8->m_bvhQuantization).m_floats[1];
        auVar21 = vcvtsi2ss_avx512f(in_XMM19,(uint)pcVar18->m_quantizedAabbMin[2]);
        fVar3 = (local_c8->m_bvhQuantization).m_floats[2];
        fVar4 = (local_c8->m_bvhAabbMin).m_floats[0];
        fVar5 = (local_c8->m_bvhAabbMin).m_floats[1];
        auVar19 = vinsertps_avx(ZEXT416((uint)(auVar19._0_4_ / fVar11 + fVar4)),
                                ZEXT416((uint)(auVar20._0_4_ / fVar1 + fVar5)),0x10);
        fVar6 = (local_c8->m_bvhAabbMin).m_floats[2];
        auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)(auVar21._0_4_ / fVar3 + fVar6)),0x28);
        auVar20 = vinsertps_avx(ZEXT416((uint)(fVar4 + (float)pcVar18->m_quantizedAabbMax[0] /
                                                       fVar11)),
                                ZEXT416((uint)(fVar5 + (float)pcVar18->m_quantizedAabbMax[1] / fVar1
                                              )),0x10);
        auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)(fVar6 + (float)pcVar18->m_quantizedAabbMax[2]
                                                               / fVar3)),0x28);
        local_f8 = auVar19._0_4_;
        fStack_f4 = auVar19._4_4_;
        fStack_f4 = fStack_f4 - local_b8->m_floats[1];
        local_f8 = local_f8 - local_b8->m_floats[0];
        fStack_f0 = auVar19._8_4_;
        uStack_ec = auVar19._12_4_;
        fStack_f0 = fStack_f0 - local_b8->m_floats[2];
        local_e8 = auVar20._0_4_;
        fStack_e4 = auVar20._4_4_;
        fStack_e4 = fStack_e4 - local_c0->m_floats[1];
        local_e8 = local_e8 - local_c0->m_floats[0];
        fStack_e0 = auVar20._8_4_;
        uStack_dc = auVar20._12_4_;
        fStack_e0 = fStack_e0 - local_c0->m_floats[2];
        auVar19 = vmulss_avx512f(auVar27._0_16_,ZEXT416((uint)(*local_88 - local_d8->m_floats[0])));
        auVar20 = vmulss_avx512f(auVar28._0_16_,ZEXT416((uint)(*local_90 - local_d8->m_floats[1])));
        uVar17 = 0;
        if (auVar19._0_4_ <= auVar20._0_4_) {
          auVar21 = vmulss_avx512f(auVar27._0_16_,ZEXT416((uint)(*local_98 - local_d8->m_floats[0]))
                                  );
          auVar22 = vmulss_avx512f(auVar28._0_16_,ZEXT416((uint)(*local_a0 - local_d8->m_floats[1]))
                                  );
          if (auVar22._0_4_ <= auVar21._0_4_) {
            auVar19 = vmaxss_avx(auVar22,auVar19);
            auVar22 = vmulss_avx512f(auVar29._0_16_,
                                     ZEXT416((uint)(*local_a8 - local_d8->m_floats[2])));
            uVar17 = 0;
            if (auVar19._0_4_ <= auVar22._0_4_) {
              auVar20 = vminss_avx(auVar20,auVar21);
              auVar21 = vmulss_avx512f(auVar29._0_16_,
                                       ZEXT416((uint)(*local_b0 - local_d8->m_floats[2])));
              if (auVar21._0_4_ <= auVar20._0_4_) {
                auVar19 = vmaxss_avx(auVar21,auVar19);
                auVar20 = vminss_avx(auVar22,auVar20);
                uVar17 = vcmpps_avx512vl(auVar19,local_78,1);
                uVar16 = vcmpps_avx512vl(auVar20,ZEXT816(0),0xe);
                uVar17 = uVar17 & uVar16;
              }
            }
          }
        }
      }
      if ((-1 < iVar7) && ((uVar17 & 1) != 0)) {
        (*local_80->_vptr_cbtNodeOverlapCallback[2])
                  (local_80,(ulong)(uint)(pcVar18->m_escapeIndexOrTriangleIndex >> 0x15),
                   (ulong)(pcVar18->m_escapeIndexOrTriangleIndex & 0x1fffff));
        auVar29 = ZEXT1664(local_68);
        auVar28 = ZEXT1664(local_58);
        auVar27 = ZEXT1664(local_48);
      }
      if ((iVar7 < 0 & ((byte)uVar17 ^ 1)) == 0) {
        pcVar18 = pcVar18 + 1;
        startNodeIndex = startNodeIndex + 1;
      }
      else {
        startNodeIndex = startNodeIndex - pcVar18->m_escapeIndexOrTriangleIndex;
        pcVar18 = pcVar18 + -(long)pcVar18->m_escapeIndexOrTriangleIndex;
      }
      iVar15 = iVar15 + 1;
    } while (startNodeIndex < endNodeIndex);
  }
  if (maxIterations < iVar15) {
    maxIterations = iVar15;
  }
  return;
}

Assistant:

void cbtQuantizedBvh::walkStacklessQuantizedTreeAgainstRay(cbtNodeOverlapCallback* nodeCallback, const cbtVector3& raySource, const cbtVector3& rayTarget, const cbtVector3& aabbMin, const cbtVector3& aabbMax, int startNodeIndex, int endNodeIndex) const
{
	cbtAssert(m_useQuantization);

	int curIndex = startNodeIndex;
	int walkIterations = 0;
	int subTreeSize = endNodeIndex - startNodeIndex;
	(void)subTreeSize;

	const cbtQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[startNodeIndex];
	int escapeIndex;

	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned boxBoxOverlap = 0;
	unsigned rayBoxOverlap = 0;

	cbtScalar lambda_max = 1.0;

#ifdef RAYAABB2
	cbtVector3 rayDirection = (rayTarget - raySource);
	rayDirection.normalize();
	lambda_max = rayDirection.dot(rayTarget - raySource);
	///what about division by zero? --> just set rayDirection[i] to 1.0
	rayDirection[0] = rayDirection[0] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDirection[0];
	rayDirection[1] = rayDirection[1] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDirection[1];
	rayDirection[2] = rayDirection[2] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDirection[2];
	unsigned int sign[3] = {rayDirection[0] < 0.0, rayDirection[1] < 0.0, rayDirection[2] < 0.0};
#endif

	/* Quick pruning by quantized box */
	cbtVector3 rayAabbMin = raySource;
	cbtVector3 rayAabbMax = raySource;
	rayAabbMin.setMin(rayTarget);
	rayAabbMax.setMax(rayTarget);

	/* Add box cast extents to bounding box */
	rayAabbMin += aabbMin;
	rayAabbMax += aabbMax;

	unsigned short int quantizedQueryAabbMin[3];
	unsigned short int quantizedQueryAabbMax[3];
	quantizeWithClamp(quantizedQueryAabbMin, rayAabbMin, 0);
	quantizeWithClamp(quantizedQueryAabbMax, rayAabbMax, 1);

	while (curIndex < endNodeIndex)
	{
//#define VISUALLY_ANALYZE_BVH 1
#ifdef VISUALLY_ANALYZE_BVH
		//some code snippet to debugDraw aabb, to visually analyze bvh structure
		static int drawPatch = 0;
		//need some global access to a debugDrawer
		extern cbtIDebugDraw* debugDrawerPtr;
		if (curIndex == drawPatch)
		{
			cbtVector3 aabbMin, aabbMax;
			aabbMin = unQuantize(rootNode->m_quantizedAabbMin);
			aabbMax = unQuantize(rootNode->m_quantizedAabbMax);
			cbtVector3 color(1, 0, 0);
			debugDrawerPtr->drawAabb(aabbMin, aabbMax, color);
		}
#endif  //VISUALLY_ANALYZE_BVH

		//catch bugs in tree data
		cbtAssert(walkIterations < subTreeSize);

		walkIterations++;
		//PCK: unsigned instead of bool
		// only interested if this is closer than any previous hit
		cbtScalar param = 1.0;
		rayBoxOverlap = 0;
		boxBoxOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin, quantizedQueryAabbMax, rootNode->m_quantizedAabbMin, rootNode->m_quantizedAabbMax);
		isLeafNode = rootNode->isLeafNode();
		if (boxBoxOverlap)
		{
			cbtVector3 bounds[2];
			bounds[0] = unQuantize(rootNode->m_quantizedAabbMin);
			bounds[1] = unQuantize(rootNode->m_quantizedAabbMax);
			/* Add box cast extents */
			bounds[0] -= aabbMax;
			bounds[1] -= aabbMin;
			cbtVector3 normal;
#if 0
			bool ra2 = cbtRayAabb2 (raySource, rayDirection, sign, bounds, param, 0.0, lambda_max);
			bool ra = cbtRayAabb (raySource, rayTarget, bounds[0], bounds[1], param, normal);
			if (ra2 != ra)
			{
				printf("functions don't match\n");
			}
#endif
#ifdef RAYAABB2
			///careful with this check: need to check division by zero (above) and fix the unQuantize method
			///thanks Joerg/hiker for the reproduction case!
			///http://www.bulletphysics.com/Bullet/phpBB3/viewtopic.php?f=9&t=1858

			//BT_PROFILE("cbtRayAabb2");
			rayBoxOverlap = cbtRayAabb2(raySource, rayDirection, sign, bounds, param, 0.0f, lambda_max);

#else
			rayBoxOverlap = true;  //cbtRayAabb(raySource, rayTarget, bounds[0], bounds[1], param, normal);
#endif
		}

		if (isLeafNode && rayBoxOverlap)
		{
			nodeCallback->processNode(rootNode->getPartId(), rootNode->getTriangleIndex());
		}

		//PCK: unsigned instead of bool
		if ((rayBoxOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		}
		else
		{
			escapeIndex = rootNode->getEscapeIndex();
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;
}